

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5cmp.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *__s1;
  undefined8 *in_RSI;
  int in_EDI;
  char buf [65];
  char *md5sum;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int local_4;
  
  if (in_EDI < 3) {
    fprintf(_stderr,"USAGE: %s <correct MD5 sum> <file>\n",*in_RSI);
    local_4 = -1;
  }
  else {
    sVar2 = strlen((char *)in_RSI[1]);
    if (sVar2 != 0x20) {
      fprintf(_stderr,"WARNING: MD5 hash size is wrong.\n");
    }
    __s1 = MD5File(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (__s1 == (char *)0x0) {
      perror("Could not obtain MD5 sum");
      local_4 = -1;
    }
    else {
      iVar1 = strcasecmp(__s1,(char *)in_RSI[1]);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s: OK\n",in_RSI[2]);
        local_4 = 0;
      }
      else {
        fprintf(_stderr,"%s: FAILED.  Checksum is %s\n",in_RSI[2],__s1);
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
  char *md5sum = NULL, buf[65];

  if (argc < 3) {
    fprintf(stderr, "USAGE: %s <correct MD5 sum> <file>\n", argv[0]);
    return -1;
  }

  if (strlen(argv[1]) != 32)
    fprintf(stderr, "WARNING: MD5 hash size is wrong.\n");

  md5sum = MD5File(argv[2], buf);
  if (!md5sum) {
    perror("Could not obtain MD5 sum");
    return -1;
  }

  if (!strcasecmp(md5sum, argv[1])) {
    fprintf(stderr, "%s: OK\n", argv[2]);
    return 0;
  } else {
    fprintf(stderr, "%s: FAILED.  Checksum is %s\n", argv[2], md5sum);
    return -1;
  }
}